

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walHashGet(Wal *pWal,int iHash,ht_slot **paHash,u32 **paPgno,u32 *piZero)

{
  u32 *puVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 in_register_00000004;
  u32 uVar3;
  u32 *aPgno;
  u32 *local_28;
  
  local_28 = (u32 *)CONCAT44(in_register_00000004,in_EAX);
  iVar2 = walIndexPage(pWal,iHash,&local_28);
  if (iVar2 == 0) {
    puVar1 = local_28 + 0x1000;
    uVar3 = iHash * 0x1000 - 0x22;
    if (iHash == 0) {
      uVar3 = 0;
      local_28 = local_28 + 0x22;
    }
    *paPgno = local_28 + -1;
    *paHash = (ht_slot *)puVar1;
    *piZero = uVar3;
  }
  return iVar2;
}

Assistant:

static int walHashGet(
  Wal *pWal,                      /* WAL handle */
  int iHash,                      /* Find the iHash'th table */
  volatile ht_slot **paHash,      /* OUT: Pointer to hash index */
  volatile u32 **paPgno,          /* OUT: Pointer to page number array */
  u32 *piZero                     /* OUT: Frame associated with *paPgno[0] */
){
  int rc;                         /* Return code */
  volatile u32 *aPgno;

  rc = walIndexPage(pWal, iHash, &aPgno);
  assert( rc==SQLITE_OK || iHash>0 );

  if( rc==SQLITE_OK ){
    u32 iZero;
    volatile ht_slot *aHash;

    aHash = (volatile ht_slot *)&aPgno[HASHTABLE_NPAGE];
    if( iHash==0 ){
      aPgno = &aPgno[WALINDEX_HDR_SIZE/sizeof(u32)];
      iZero = 0;
    }else{
      iZero = HASHTABLE_NPAGE_ONE + (iHash-1)*HASHTABLE_NPAGE;
    }
  
    *paPgno = &aPgno[-1];
    *paHash = aHash;
    *piZero = iZero;
  }
  return rc;
}